

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O0

void InitEncoderDictionary(BrotliEncoderDictionary *dict)

{
  BrotliDictionary *pBVar1;
  BrotliTransforms *pBVar2;
  undefined8 *in_RDI;
  
  pBVar1 = duckdb_brotli::BrotliGetDictionary();
  *in_RDI = pBVar1;
  pBVar2 = duckdb_brotli::BrotliGetTransforms();
  *(uint32_t *)(in_RDI + 1) = pBVar2->num_transforms;
  in_RDI[3] = duckdb_brotli::kStaticDictionaryHashWords;
  in_RDI[4] = duckdb_brotli::kStaticDictionaryHashLengths;
  in_RDI[5] = &duckdb_brotli::kStaticDictionaryBuckets;
  in_RDI[6] = duckdb_brotli::kStaticDictionaryWords;
  *(undefined4 *)((long)in_RDI + 0xc) = 10;
  in_RDI[2] = 0x71b520ada2d3200;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  BrotliTrieInit((BrotliTrie *)(in_RDI + 7));
  return;
}

Assistant:

static void InitEncoderDictionary(BrotliEncoderDictionary* dict) {
  dict->words = BrotliGetDictionary();
  dict->num_transforms = (uint32_t)BrotliGetTransforms()->num_transforms;

  dict->hash_table_words = kStaticDictionaryHashWords;
  dict->hash_table_lengths = kStaticDictionaryHashLengths;
  dict->buckets = kStaticDictionaryBuckets;
  dict->dict_words = kStaticDictionaryWords;

  dict->cutoffTransformsCount = kCutoffTransformsCount;
  dict->cutoffTransforms = kCutoffTransforms;

  dict->parent = 0;

  dict->hash_table_data_words_ = 0;
  dict->hash_table_data_lengths_ = 0;
  dict->buckets_alloc_size_ = 0;
  dict->buckets_data_ = 0;
  dict->dict_words_alloc_size_ = 0;
  dict->dict_words_data_ = 0;
  dict->words_instance_ = 0;
  dict->has_words_heavy = BROTLI_FALSE;
  BrotliTrieInit(&dict->trie);
}